

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void findtest(void)

{
  char *__s1;
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong unaff_R13;
  int unaff_R14D;
  uint uVar9;
  long lVar10;
  int index;
  uint local_54;
  long local_50;
  int local_48;
  uint local_44;
  long local_40;
  ulong local_38;
  
  lVar5 = 0;
  do {
    __s1 = strings[lVar5];
    lVar10 = 0;
    local_40 = lVar5;
    do {
      ppvVar1 = array;
      local_38 = (ulong)(uint)arraylen;
      uVar6 = arraylen - 1;
      local_50 = lVar10;
      local_44 = uVar6;
      if (arraylen < 1) {
        uVar9 = 0;
        iVar4 = findtest::rels[lVar10];
      }
      else {
        uVar9 = 0;
        local_48 = findtest::rels[lVar10];
        do {
          uVar7 = uVar6 + uVar9 >> 1;
          unaff_R13 = (ulong)uVar7;
          unaff_R14D = strcmp(__s1,(char *)ppvVar1[unaff_R13]);
          iVar4 = local_48;
          if (unaff_R14D < 0) {
            uVar6 = uVar7 - 1;
          }
          else {
            if (unaff_R14D == 0) {
              unaff_R14D = 0;
              break;
            }
            uVar9 = uVar7 + 1;
          }
        } while ((int)uVar9 <= (int)uVar6);
      }
      lVar10 = local_50;
      uVar7 = (uint)local_50;
      if (unaff_R14D == 0) {
        iVar8 = (int)unaff_R13;
        if (uVar7 == 4) {
          if ((int)local_44 <= iVar8) {
LAB_00103244:
            pvVar3 = (void *)0x0;
            goto LAB_00103259;
          }
          unaff_R13 = (ulong)(iVar8 + 1);
          ppvVar1 = array + (long)iVar8 + 1;
        }
        else {
          if (uVar7 == 3) {
            if (iVar8 < 1) goto LAB_00103244;
            unaff_R13 = (ulong)(iVar8 - 1);
            lVar5 = unaff_R13 * 8;
          }
          else {
            lVar5 = (long)iVar8 << 3;
          }
          ppvVar1 = (void **)(lVar5 + (long)array);
        }
LAB_00103238:
        pvVar3 = *ppvVar1;
      }
      else {
        if (uVar9 != uVar6 + 1) {
          __assert_fail("lo == hi + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                        ,0x58c,"void findtest(void)");
        }
        if ((uVar7 & 6) == 2) {
          if (-1 < (int)uVar6) {
LAB_00103205:
            ppvVar1 = array + uVar6;
            unaff_R13 = (ulong)uVar6;
            goto LAB_00103238;
          }
        }
        else {
          if ((uVar7 != 4) && (uVar7 != 1)) {
            pvVar3 = (void *)0x0;
            goto LAB_00103259;
          }
          uVar6 = uVar9;
          if ((int)uVar9 < (int)local_38) goto LAB_00103205;
        }
        unaff_R13 = (ulong)uVar6;
        pvVar3 = (void *)0x0;
      }
LAB_00103259:
      pvVar2 = findrelpos234(tree,__s1,(cmpfn234)0x0,iVar4,(int *)&local_54);
      if (pvVar2 != pvVar3) {
        error("find(\"%s\",%s) gave %s should be %s",__s1,findtest::relnames[lVar10],pvVar2,pvVar3);
      }
      if ((pvVar2 != (void *)0x0) && (local_54 != (uint)unaff_R13)) {
        error("find(\"%s\",%s) gave %d should be %d",__s1,findtest::relnames[lVar10],(ulong)local_54
              ,unaff_R13 & 0xffffffff);
      }
      uVar6 = local_54;
      if (((lVar10 == 0) && (pvVar2 != (void *)0x0)) &&
         (pvVar3 = index234(tree,local_54), pvVar3 != pvVar2)) {
        error("find(\"%s\",%s) gave %s(%d) but %d -> %s",__s1,"EQ",pvVar2,(ulong)uVar6,(ulong)uVar6,
              pvVar3);
      }
      if (verbose != 0) {
        printf("find(\"%s\",%s) gave %s(%d)\n",__s1,findtest::relnames[lVar10],pvVar2,
               (ulong)local_54);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar5 = local_40 + 1;
    if (lVar5 == 0x3c) {
      pvVar3 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,3,(int *)&local_54);
      if ((arraylen == 0) || (local_54 == 0 && pvVar3 == *array)) {
        if (pvVar3 != (void *)0x0 && arraylen == 0) {
          error("find(NULL,GT) gave %s(%d) should be NULL",pvVar3,(ulong)local_54);
        }
      }
      else {
        error("find(NULL,GT) gave %s(%d) should be %s(0)");
      }
      pvVar3 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,1,(int *)&local_54);
      lVar5 = (long)arraylen;
      if ((lVar5 == 0) || (pvVar3 == array[lVar5 + -1] && local_54 == arraylen - 1U)) {
        if (pvVar3 != (void *)0x0 && arraylen == 0) {
          error("find(NULL,LT) gave %s(%d) should be NULL",pvVar3,(ulong)local_54);
        }
      }
      else {
        error("find(NULL,LT) gave %s(%d) should be %s(0)",pvVar3,(ulong)local_54,array[lVar5 + -1]);
      }
      return;
    }
  } while( true );
}

Assistant:

void findtest(void)
{
    const static int rels[] = {
        REL234_EQ, REL234_GE, REL234_LE, REL234_LT, REL234_GT
    };
    const static char *const relnames[] = {
        "EQ", "GE", "LE", "LT", "GT"
    };
    int i, j, rel, index;
    char *p, *ret, *realret, *realret2;
    int lo, hi, mid, c;

    for (i = 0; i < NSTR; i++) {
        p = strings[i];
        for (j = 0; j < sizeof(rels) / sizeof(*rels); j++) {
            rel = rels[j];

            lo = 0;
            hi = arraylen - 1;
            while (lo <= hi) {
                mid = (lo + hi) / 2;
                c = strcmp(p, array[mid]);
                if (c < 0)
                    hi = mid - 1;
                else if (c > 0)
                    lo = mid + 1;
                else
                    break;
            }

            if (c == 0) {
                if (rel == REL234_LT)
                    ret = (mid > 0 ? array[--mid] : NULL);
                else if (rel == REL234_GT)
                    ret = (mid < arraylen - 1 ? array[++mid] : NULL);
                else
                    ret = array[mid];
            } else {
                assert(lo == hi + 1);
                if (rel == REL234_LT || rel == REL234_LE) {
                    mid = hi;
                    ret = (hi >= 0 ? array[hi] : NULL);
                } else if (rel == REL234_GT || rel == REL234_GE) {
                    mid = lo;
                    ret = (lo < arraylen ? array[lo] : NULL);
                } else
                    ret = NULL;
            }

            realret = findrelpos234(tree, p, NULL, rel, &index);
            if (realret != ret) {
                error("find(\"%s\",%s) gave %s should be %s",
                      p, relnames[j], realret, ret);
            }
            if (realret && index != mid) {
                error("find(\"%s\",%s) gave %d should be %d",
                      p, relnames[j], index, mid);
            }
            if (realret && rel == REL234_EQ) {
                realret2 = index234(tree, index);
                if (realret2 != realret) {
                    error("find(\"%s\",%s) gave %s(%d) but %d -> %s",
                          p, relnames[j], realret, index, index, realret2);
                }
            }
            if (verbose)
                printf("find(\"%s\",%s) gave %s(%d)\n", p, relnames[j],
                       realret, index);
        }
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_GT, &index);
    if (arraylen && (realret != array[0] || index != 0)) {
        error("find(NULL,GT) gave %s(%d) should be %s(0)",
              realret, index, (char *)array[0]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,GT) gave %s(%d) should be NULL", realret, index);
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_LT, &index);
    if (arraylen
        && (realret != array[arraylen - 1] || index != arraylen - 1)) {
        error("find(NULL,LT) gave %s(%d) should be %s(0)", realret, index,
              (char *)array[arraylen - 1]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,LT) gave %s(%d) should be NULL", realret, index);
    }
}